

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void Js::JavascriptArray::MergeSort<long>
               (long *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long *plVar12;
  uint uVar13;
  long lVar14;
  long local_90;
  CompareVarsInfo *local_88;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *local_80;
  char *local_78;
  ulong local_70;
  uint local_64;
  ulong local_60;
  ulong local_58;
  long local_50;
  long rightElement;
  long *local_40;
  long *local_38;
  
  local_80 = cvInfo->compareType;
  local_88 = cvInfo;
  local_38 = list;
  if (length == 0) {
    pcVar6 = &DAT_00000008;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00bb2566;
      *puVar5 = 0;
    }
    pcVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&allocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,(ulong)length << 3);
    if (pcVar6 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00bb2566:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  local_64 = length * 2;
  if (2 < local_64) {
    uVar7 = 2;
    uVar9 = 1;
    plVar12 = local_38;
    local_78 = pcVar6;
    do {
      rightElement = uVar7;
      if (length != 0) {
        local_58 = uVar9 & 0xffffffff;
        local_60 = 0;
        do {
          uVar13 = (int)local_60 + (int)uVar9;
          if (uVar13 < length) {
            local_70 = (ulong)(uVar13 - 1);
            local_40 = plVar12 + local_70;
            bVar3 = (*local_80)(local_88,plVar12 + uVar13,local_40);
            if (bVar3) {
              uVar8 = (int)local_60 + (int)rightElement;
              if (length <= uVar8) {
                uVar8 = length;
              }
              uVar10 = 0xffffffff;
              if (uVar13 < uVar8) {
                lVar11 = 0;
                do {
                  *(long *)(pcVar6 + lVar11 * 8) = local_38[(local_58 & 0xffffffff) + lVar11];
                  lVar14 = (local_58 & 0xffffffff) + lVar11;
                  lVar11 = lVar11 + 1;
                } while (lVar14 + 1U < (ulong)uVar8);
                uVar13 = (int)local_58 + (int)lVar11;
                uVar10 = (int)lVar11 - 1;
              }
              local_50 = *(long *)(pcVar6 + (ulong)uVar10 * 8);
              while( true ) {
                local_90 = *local_40;
                lVar11 = 0;
                local_40 = (long *)(ulong)uVar13;
                while( true ) {
                  lVar14 = (ulong)uVar10 + lVar11;
                  bVar3 = (*local_80)(local_88,&local_50,&local_90);
                  iVar2 = (int)lVar11;
                  uVar8 = (uVar13 - 1) + iVar2;
                  if (bVar3) break;
                  local_38[uVar8] = local_50;
                  if ((int)lVar14 == 0) {
                    uVar13 = ((int)local_40 + iVar2) - 1;
                    goto LAB_00bb24ed;
                  }
                  local_50 = *(long *)(local_78 + (ulong)(iVar2 + (uVar10 - 1)) * 8);
                  lVar11 = lVar11 + -1;
                }
                local_38[uVar8] = local_90;
                if ((uint)local_70 <= (uint)local_60) break;
                uVar10 = uVar10 + iVar2;
                uVar13 = (uVar13 - 1) + iVar2;
                local_70 = (ulong)((uint)local_70 - 1);
                local_40 = local_38 + local_70;
              }
              uVar13 = ((int)local_40 + iVar2) - 2;
              local_38[uVar13] = local_50;
LAB_00bb24ed:
              plVar12 = local_38;
              pcVar6 = local_78;
              if (uVar10 + iVar2 != 0) {
                do {
                  uVar13 = uVar13 - 1;
                  local_38[uVar13] = *(long *)(local_78 + lVar14 * 8 + -8);
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
            }
          }
          uVar13 = (int)local_60 + (int)rightElement;
          local_60 = (ulong)uVar13;
          local_58 = local_58 + uVar7;
        } while (uVar13 < length);
      }
      uVar13 = (int)rightElement * 2;
      uVar7 = (ulong)uVar13;
      uVar9 = rightElement;
    } while (uVar13 < local_64);
  }
  return;
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }